

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O2

Slice __thiscall leveldb::MemTableIterator::value(MemTableIterator *this)

{
  long lVar1;
  char **ppcVar2;
  long in_FS_OFFSET;
  Slice SVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ppcVar2 = SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Iterator::key(&this->iter_);
  SVar3 = GetLengthPrefixedSlice(*ppcVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    SVar3 = GetLengthPrefixedSlice(SVar3.data_ + SVar3.size_);
    return SVar3;
  }
  __stack_chk_fail();
}

Assistant:

Slice value() const override {
    Slice key_slice = GetLengthPrefixedSlice(iter_.key());
    return GetLengthPrefixedSlice(key_slice.data() + key_slice.size());
  }